

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colormaps.cpp
# Opt level: O1

void R_InitColormaps(void)

{
  FakeCmap *pFVar1;
  byte bVar2;
  BYTE *pBVar3;
  BYTE BVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  int c;
  BYTE (*paBVar14) [256];
  int m;
  ulong uVar15;
  BYTE *pBVar16;
  char cVar17;
  bool bVar18;
  FakeCmap cm;
  FWadLump lump;
  char name [9];
  BYTE remap [256];
  BYTE mapin [256];
  char local_390;
  undefined7 uStack_38f;
  undefined4 uStack_388;
  int iStack_384;
  ulong local_380;
  long local_378;
  FWadLump local_370;
  byte local_338 [256];
  byte local_238 [256];
  byte local_138 [264];
  
  R_DeinitColormaps();
  local_390 = '\0';
  uStack_388 = 0;
  TArray<FakeCmap,_FakeCmap>::Grow(&fakecmaps,1);
  pFVar1 = fakecmaps.Array + fakecmaps.Count;
  *(ulong *)pFVar1->name = CONCAT71(uStack_38f,local_390);
  pFVar1->blend = (PalEntry)uStack_388;
  pFVar1->lump = iStack_384;
  fakecmaps.Count = fakecmaps.Count + 1;
  iVar5 = FWadCollection::GetNumLumps(&Wads);
  if (iVar5 != 0) {
    iVar12 = 0;
    do {
      iVar6 = FWadCollection::GetLumpNamespace(&Wads,iVar12);
      if (iVar6 == 3) {
        local_338[8] = 0;
        FWadCollection::GetLumpName(&Wads,(char *)local_338,iVar12);
        iVar6 = FWadCollection::CheckNumForName(&Wads,(char *)local_338,3);
        if (iVar12 == iVar6) {
          strncpy(&local_390,(char *)local_338,8);
          uStack_388 = 0;
          iStack_384 = iVar12;
          TArray<FakeCmap,_FakeCmap>::Grow(&fakecmaps,1);
          pFVar1 = fakecmaps.Array + fakecmaps.Count;
          *(ulong *)pFVar1->name = CONCAT71(uStack_38f,local_390);
          pFVar1->blend = (PalEntry)uStack_388;
          pFVar1->lump = iStack_384;
          fakecmaps.Count = fakecmaps.Count + 1;
        }
      }
      iVar12 = iVar12 + 1;
    } while (iVar5 != iVar12);
  }
  realcolormaps = (BYTE *)operator_new__((ulong)(fakecmaps.Count << 0xd));
  R_SetDefaultColormap("COLORMAP");
  if (1 < fakecmaps.Count) {
    memcpy(local_238,GPalette.Remap,0x100);
    lVar11 = 0;
    memset(local_338,0,0x100);
    do {
      local_338[local_238[lVar11]] = (byte)lVar11;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x100);
    local_238[0] = 0;
    if (1 < fakecmaps.Count) {
      uVar13 = 1;
      do {
        iVar5 = FWadCollection::LumpLength(&Wads,fakecmaps.Array[uVar13].lump);
        if (0x20ff < iVar5) {
          uVar15 = (ulong)(uint)((int)uVar13 << 0xd);
          local_378 = uVar13 * 0x10;
          FWadCollection::OpenLumpNum(&local_370,&Wads,fakecmaps.Array[uVar13].lump);
          pBVar3 = realcolormaps;
          pBVar16 = realcolormaps + uVar15;
          lVar11 = 0;
          local_380 = uVar15;
          do {
            FWadLump::Read(&local_370,local_138,0x100);
            pBVar3[lVar11 * 0x100 + (ulong)(uint)((int)uVar13 << 0xd)] = '\0';
            lVar8 = 1;
            do {
              pBVar16[lVar8] = local_238[local_138[local_338[lVar8]]];
              lVar8 = lVar8 + 1;
            } while (lVar8 != 0x100);
            lVar11 = lVar11 + 1;
            pBVar16 = pBVar16 + 0x100;
          } while (lVar11 != 0x20);
          lVar11 = 0;
          uVar7 = 0;
          uVar9 = 0;
          uVar10 = 0;
          do {
            bVar2 = pBVar3[lVar11 + local_380];
            uVar7 = uVar7 + GPalette.BaseColors[bVar2].field_0.field_0.r;
            uVar9 = uVar9 + GPalette.BaseColors[bVar2].field_0.field_0.g;
            uVar10 = uVar10 + GPalette.BaseColors[bVar2].field_0.field_0.b;
            lVar11 = lVar11 + 1;
          } while (lVar11 != 0x100);
          *(uint *)((fakecmaps.Array)->name + local_378 + 8) =
               (uVar7 & 0xff00) * 0x100 + (uVar10 >> 8 & 0xff | uVar9 & 0xff00) + -0x1000000;
          FWadLump::~FWadLump(&local_370);
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < fakecmaps.Count);
    }
  }
  if (realfbcolormaps == (BYTE *)0x0) {
    uVar7 = fakecmaps.Count << 0xd;
    realfbcolormaps = (BYTE *)operator_new__((ulong)uVar7);
    memcpy(realfbcolormaps,realcolormaps,(ulong)uVar7);
  }
  pBVar3 = realcolormaps;
  NormalLight.Color.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)0xffffff;
  NormalLight.Fade.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)0x0;
  NormalLight.Maps = realcolormaps;
  FullNormalLight.Color.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)0xffffff;
  FullNormalLight.Fade.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)0x0;
  FullNormalLight.Maps = realfbcolormaps;
  lVar11 = 0;
  memset(local_338,0,0x100);
  do {
    local_338[pBVar3[lVar11 + 0x1f00]] = local_338[pBVar3[lVar11 + 0x1f00]] + 1;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x100);
  pBVar16 = pBVar3 + 0xff;
  NormalLightHasFixedLights = true;
  lVar11 = 0xff;
  do {
    cVar17 = '\a';
    if (local_338[pBVar3[lVar11 + 0x1f00]] < 0xb) {
      lVar8 = -0x1f00;
      do {
        if (pBVar16[lVar8 + 0x1f00] != pBVar3[lVar11 + 0x1f00]) {
          cVar17 = lVar8 == 0;
          goto LAB_0032f9aa;
        }
        lVar8 = lVar8 + 0x100;
      } while (lVar8 != 0);
      cVar17 = '\x01';
    }
LAB_0032f9aa:
    if ((cVar17 != '\a') && (cVar17 != '\0')) break;
    NormalLightHasFixedLights = lVar11 != 0;
    pBVar16 = pBVar16 + -1;
    bVar18 = lVar11 != 0;
    lVar11 = lVar11 + -1;
  } while (bVar18);
  numfakecmaps = (size_t)fakecmaps.Count;
  lVar11 = 0;
  do {
    AddSpecialColormap(*(float *)((long)SpecialColormapParms[0].Start + lVar11),
                       *(float *)((long)SpecialColormapParms[0].Start + lVar11 + 4),
                       *(float *)((long)SpecialColormapParms[0].Start + lVar11 + 8),
                       *(float *)((long)SpecialColormapParms[0].End + lVar11),
                       *(float *)((long)SpecialColormapParms[0].End + lVar11 + 4),
                       *(float *)((long)SpecialColormapParms[0].End + lVar11 + 8));
    lVar11 = lVar11 + 0x18;
  } while (lVar11 != 0x78);
  paBVar14 = DesaturateColormap;
  lVar11 = 0;
  do {
    iVar5 = 0x1f - (int)lVar11;
    lVar8 = 0;
    do {
      uVar10 = (uint)GPalette.BaseColors[lVar8].field_0.field_0.r;
      uVar9 = (uint)GPalette.BaseColors[lVar8].field_0.field_0.g;
      uVar7 = (uint)GPalette.BaseColors[lVar8].field_0.field_0.b;
      iVar12 = (uVar7 * 0x25 + uVar9 * 0x8f + uVar10 * 0x4d >> 8) * (int)lVar11;
      BVar4 = FColorMatcher::Pick(&ColorMatcher,(uVar10 * iVar5 + iVar12) / 0x1f,
                                  (uVar9 * iVar5 + iVar12) / 0x1f,(uVar7 * iVar5 + iVar12) / 0x1f);
      (*paBVar14)[lVar8] = BVar4;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x100);
    lVar11 = lVar11 + 1;
    paBVar14 = paBVar14 + 1;
  } while (lVar11 != 0x1f);
  return;
}

Assistant:

void R_InitColormaps ()
{
	// [RH] Try and convert BOOM colormaps into blending values.
	//		This is a really rough hack, but it's better than
	//		not doing anything with them at all (right?)

	FakeCmap cm;

	R_DeinitColormaps();

	cm.name[0] = 0;
	cm.blend = 0;
	fakecmaps.Push(cm);

	DWORD NumLumps = Wads.GetNumLumps();

	for (DWORD i = 0; i < NumLumps; i++)
	{
		if (Wads.GetLumpNamespace(i) == ns_colormaps)
		{
			char name[9];
			name[8] = 0;
			Wads.GetLumpName (name, i);

			if (Wads.CheckNumForName (name, ns_colormaps) == (int)i)
			{
				strncpy(cm.name, name, 8);
				cm.blend = 0;
				cm.lump = i;
				fakecmaps.Push(cm);
			}
		}
	}
	realcolormaps = new BYTE[256*NUMCOLORMAPS*fakecmaps.Size()];
	R_SetDefaultColormap ("COLORMAP");

	if (fakecmaps.Size() > 1)
	{
		BYTE unremap[256], remap[256], mapin[256];
		int i;
		unsigned j;

		memcpy (remap, GPalette.Remap, 256);
		memset (unremap, 0, 256);
		for (i = 0; i < 256; ++i)
		{
			unremap[remap[i]] = i;
		}
		remap[0] = 0;
		for (j = 1; j < fakecmaps.Size(); j++)
		{
			if (Wads.LumpLength (fakecmaps[j].lump) >= (NUMCOLORMAPS+1)*256)
			{
				int k, r, g, b;
				FWadLump lump = Wads.OpenLumpNum (fakecmaps[j].lump);
				BYTE *const map = realcolormaps + NUMCOLORMAPS*256*j;

				for (k = 0; k < NUMCOLORMAPS; ++k)
				{
					BYTE *map2 = &map[k*256];
					lump.Read (mapin, 256);
					map2[0] = 0;
					for (r = 1; r < 256; ++r)
					{
						map2[r] = remap[mapin[unremap[r]]];
					}
				}

				r = g = b = 0;

				for (k = 0; k < 256; k++)
				{
					r += GPalette.BaseColors[map[k]].r;
					g += GPalette.BaseColors[map[k]].g;
					b += GPalette.BaseColors[map[k]].b;
				}
				fakecmaps[j].blend = PalEntry (255, r/256, g/256, b/256);
			}
		}
	}

	// [SP] Create a copy of the colormap
	if (!realfbcolormaps)
	{
		realfbcolormaps = new BYTE[256*NUMCOLORMAPS*fakecmaps.Size()];
		memcpy(realfbcolormaps, realcolormaps, 256*NUMCOLORMAPS*fakecmaps.Size());
	}

	NormalLight.Color = PalEntry (255, 255, 255);
	NormalLight.Fade = 0;
	NormalLight.Maps = realcolormaps;
	FullNormalLight.Color = PalEntry (255, 255, 255);
	FullNormalLight.Fade = 0;
	FullNormalLight.Maps = realfbcolormaps;
	NormalLightHasFixedLights = R_CheckForFixedLights(realcolormaps);
	numfakecmaps = fakecmaps.Size();

	// build default special maps (e.g. invulnerability)

	for (unsigned i = 0; i < countof(SpecialColormapParms); ++i)
	{
		AddSpecialColormap(SpecialColormapParms[i].Start[0], SpecialColormapParms[i].Start[1],
			SpecialColormapParms[i].Start[2], SpecialColormapParms[i].End[0],
			SpecialColormapParms[i].End[1], SpecialColormapParms[i].End[2]);
	}
	// desaturated colormaps. These are used for texture composition
	for(int m = 0; m < 31; m++)
	{
		BYTE *shade = DesaturateColormap[m];
		for (int c = 0; c < 256; c++)
		{
			int intensity = (GPalette.BaseColors[c].r * 77 +
						GPalette.BaseColors[c].g * 143 +
						GPalette.BaseColors[c].b * 37) / 256;

			int r = (GPalette.BaseColors[c].r * (31-m) + intensity *m) / 31;
			int g = (GPalette.BaseColors[c].g * (31-m) + intensity *m) / 31;
			int b = (GPalette.BaseColors[c].b * (31-m) + intensity *m) / 31;
			shade[c] = ColorMatcher.Pick(r, g, b);
		}
	}
}